

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_help.cpp
# Opt level: O0

int __thiscall ktx::OptionsHelp::init(OptionsHelp *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  string *in_stack_fffffffffffffe58;
  shared_ptr<const_cxxopts::Value> *in_stack_fffffffffffffe60;
  Options *this_00;
  allocator<char> *in_stack_fffffffffffffe90;
  allocator<char> *__a;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  allocator<char> local_151;
  string *in_stack_fffffffffffffeb0;
  Options *in_stack_fffffffffffffeb8;
  allocator<char> local_129;
  string local_128 [32];
  string *in_stack_fffffffffffffef8;
  Options *in_stack_ffffffffffffff00;
  allocator<char> local_b9;
  string local_b8 [39];
  allocator<char> local_91;
  string local_90 [16];
  string *in_stack_ffffffffffffff80;
  shared_ptr<const_cxxopts::Value> *in_stack_ffffffffffffff88;
  string *in_stack_ffffffffffffff90;
  string *in_stack_ffffffffffffff98;
  OptionAdder *in_stack_ffffffffffffffa0;
  string local_58 [72];
  Options *local_10;
  OptionsHelp *local_8;
  
  this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            &stack0xffffffffffffffa7;
  local_10 = (Options *)ctx;
  local_8 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_01,(char *)ctx,in_stack_fffffffffffffe90);
  cxxopts::Options::add_options(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
  __a = &local_91;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_01,(char *)ctx,__a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_01,(char *)ctx,__a);
  cxxopts::value<std::__cxx11::string>();
  std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
            (in_stack_fffffffffffffe60,(shared_ptr<cxxopts::Value> *)in_stack_fffffffffffffe58);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_01,(char *)ctx,__a);
  cxxopts::OptionAdder::operator()
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
             in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff00);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffeff);
  std::shared_ptr<const_cxxopts::Value>::~shared_ptr((shared_ptr<const_cxxopts::Value> *)0x29d2ae);
  std::shared_ptr<cxxopts::Value>::~shared_ptr((shared_ptr<cxxopts::Value> *)0x29d2bb);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator(&local_b9);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator(&local_91);
  cxxopts::OptionAdder::~OptionAdder((OptionAdder *)0x29d2fc);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffa7);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_01,(char *)ctx,__a);
  cxxopts::Options::parse_positional(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  std::__cxx11::string::~string(local_128);
  std::allocator<char>::~allocator(&local_129);
  this_00 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_01,(char *)ctx,__a);
  cxxopts::Options::positional_help(this_00,in_stack_fffffffffffffe58);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffeb0);
  iVar1 = std::allocator<char>::~allocator(&local_151);
  return iVar1;
}

Assistant:

void init(cxxopts::Options& opts) {
        opts.add_options()
                ("command", "The command for which usage should be displayed.", cxxopts::value<std::string>());
        opts.parse_positional("command");
        opts.positional_help("<command>");
    }